

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::createConnection
          (PortConnectionBuilder *this,InterfacePortSymbol *port,IfaceConn ifaceConn,
          Expression *expr,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  PortConnection *conn;
  pointer in_R9;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  Expression *local_38;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> local_30;
  
  local_30.second = ifaceConn.second;
  local_30.first = ifaceConn.first;
  local_38 = expr;
  conn = BumpAllocator::
         emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>&,slang::ast::Expression_const*&>
                   (&this->comp->super_BumpAllocator,port,&local_30,&local_38);
  if (attributes._M_ptr != (pointer)0x0) {
    attributes_00._M_extent._M_extent_value = (size_t)attributes._M_ptr;
    attributes_00._M_ptr = in_R9;
    Compilation::setAttributes(this->comp,conn,attributes_00);
  }
  return conn;
}

Assistant:

PortConnection* createConnection(const InterfacePortSymbol& port,
                                     PortConnection::IfaceConn ifaceConn, const Expression* expr,
                                     std::span<const AttributeSymbol* const> attributes) {
        auto conn = comp.emplace<PortConnection>(port, ifaceConn, expr);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }